

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.h
# Opt level: O2

uint8_t slab_order(slab_cache *cache,size_t size)

{
  int iVar1;
  uint8_t uVar2;
  uint uVar3;
  
  if (cache->order0_size < size) {
    if (cache->arena->slab_size < size) {
      uVar2 = cache->order_max + '\x01';
    }
    else {
      uVar3 = (int)size - 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar2 = ' ' - (((byte)iVar1 ^ 0x1f) + cache->order0_size_lb);
    }
    return uVar2;
  }
  return '\0';
}

Assistant:

static inline uint8_t
slab_order(struct slab_cache *cache, size_t size)
{
	if (size <= cache->order0_size)
		return 0;
	if (size > cache->arena->slab_size)
		return cache->order_max + 1;

	return (uint8_t) (CHAR_BIT * sizeof(unsigned) -
			  __builtin_clz((unsigned) size - 1) -
			  cache->order0_size_lb);
}